

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cli.c
# Opt level: O0

int ssl_parse_certificate_request(mbedtls_ssl_context *ssl)

{
  uchar uVar1;
  uchar uVar2;
  mbedtls_ssl_ciphersuite_t *pmVar3;
  uchar *puVar4;
  ulong uVar5;
  int iVar6;
  size_t sVar7;
  mbedtls_pk_context *pmVar8;
  size_t sVar9;
  char *pcVar10;
  size_t sig_alg_len;
  mbedtls_ssl_ciphersuite_t *ciphersuite_info;
  size_t dn_len;
  size_t cert_type_len;
  size_t m;
  size_t n;
  uchar *p;
  uchar *buf;
  int ret;
  mbedtls_ssl_context *ssl_local;
  
  cert_type_len = 0;
  pmVar3 = ssl->transform_negotiate->ciphersuite_info;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
             ,0x945,"=> parse certificate request");
  if ((((pmVar3->key_exchange == MBEDTLS_KEY_EXCHANGE_PSK) ||
       (pmVar3->key_exchange == MBEDTLS_KEY_EXCHANGE_RSA_PSK)) ||
      (pmVar3->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_PSK)) ||
     (pmVar3->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_PSK)) {
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0x94c,"<= skip parse certificate request");
    ssl->state = ssl->state + 1;
    return 0;
  }
  if (ssl->record_read == 0) {
    iVar6 = mbedtls_ssl_read_record(ssl);
    if (iVar6 != 0) {
      mbedtls_debug_print_ret
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0x955,"mbedtls_ssl_read_record",iVar6);
      return iVar6;
    }
    if (ssl->in_msgtype != 0x16) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0x95b,"bad certificate request message");
      return -0x7700;
    }
    ssl->record_read = 1;
  }
  ssl->client_auth = 0;
  ssl->state = ssl->state + 1;
  if (*ssl->in_msg == '\r') {
    ssl->client_auth = ssl->client_auth + 1;
  }
  pcVar10 = "no";
  if (ssl->client_auth != 0) {
    pcVar10 = "a";
  }
  mbedtls_debug_print_msg
            (ssl,3,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
             ,0x969,"got %s certificate request",pcVar10);
  if (ssl->client_auth != 0) {
    ssl->record_read = 0;
    puVar4 = ssl->in_msg;
    sVar7 = mbedtls_ssl_hs_hdr_len(ssl);
    m = (size_t)puVar4[sVar7];
    uVar5 = ssl->in_hslen;
    sVar7 = mbedtls_ssl_hs_hdr_len(ssl);
    if (uVar5 < sVar7 + 2 + m) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0x984,"bad certificate request message");
      return -0x7a80;
    }
    sVar7 = mbedtls_ssl_hs_hdr_len(ssl);
    n = (size_t)(puVar4 + sVar7);
    for (dn_len = m; n = n + 1, dn_len != 0; dn_len = dn_len - 1) {
      if (*(char *)n == '\x01') {
        pmVar8 = mbedtls_ssl_own_key(ssl);
        iVar6 = mbedtls_pk_can_do(pmVar8,MBEDTLS_PK_RSA);
        if (iVar6 != 0) {
          ssl->handshake->cert_type = 1;
          break;
        }
      }
      if (*(char *)n == '@') {
        pmVar8 = mbedtls_ssl_own_key(ssl);
        iVar6 = mbedtls_pk_can_do(pmVar8,MBEDTLS_PK_ECDSA);
        if (iVar6 != 0) {
          ssl->handshake->cert_type = 0x40;
          break;
        }
      }
    }
    if (ssl->minor_ver == 3) {
      sVar7 = mbedtls_ssl_hs_hdr_len(ssl);
      uVar1 = puVar4[sVar7 + 1 + m];
      sVar7 = mbedtls_ssl_hs_hdr_len(ssl);
      cert_type_len = 2;
      m = (long)(int)(uint)CONCAT11(uVar1,puVar4[sVar7 + 2 + m]) + m;
      uVar5 = ssl->in_hslen;
      sVar7 = mbedtls_ssl_hs_hdr_len(ssl);
      if (uVar5 < sVar7 + 2 + m) {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                   ,0x9b2,"bad certificate request message");
        return -0x7a80;
      }
    }
    sVar7 = mbedtls_ssl_hs_hdr_len(ssl);
    uVar1 = puVar4[sVar7 + 1 + cert_type_len + m];
    sVar7 = mbedtls_ssl_hs_hdr_len(ssl);
    uVar2 = puVar4[sVar7 + 2 + cert_type_len + m];
    sVar7 = ssl->in_hslen;
    sVar9 = mbedtls_ssl_hs_hdr_len(ssl);
    if (sVar7 != sVar9 + 3 + cert_type_len + (long)(int)(uint)CONCAT11(uVar1,uVar2) + m) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0x9c0,"bad certificate request message");
      return -0x7a80;
    }
  }
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
             ,0x9c5,"<= parse certificate request");
  return 0;
}

Assistant:

static int ssl_parse_certificate_request( mbedtls_ssl_context *ssl )
{
    int ret;
    unsigned char *buf, *p;
    size_t n = 0, m = 0;
    size_t cert_type_len = 0, dn_len = 0;
    const mbedtls_ssl_ciphersuite_t *ciphersuite_info = ssl->transform_negotiate->ciphersuite_info;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> parse certificate request" ) );

    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_RSA_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_PSK )
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= skip parse certificate request" ) );
        ssl->state++;
        return( 0 );
    }

    if( ssl->record_read == 0 )
    {
        if( ( ret = mbedtls_ssl_read_record( ssl ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_read_record", ret );
            return( ret );
        }

        if( ssl->in_msgtype != MBEDTLS_SSL_MSG_HANDSHAKE )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate request message" ) );
            return( MBEDTLS_ERR_SSL_UNEXPECTED_MESSAGE );
        }

        ssl->record_read = 1;
    }

    ssl->client_auth = 0;
    ssl->state++;

    if( ssl->in_msg[0] == MBEDTLS_SSL_HS_CERTIFICATE_REQUEST )
        ssl->client_auth++;

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "got %s certificate request",
                        ssl->client_auth ? "a" : "no" ) );

    if( ssl->client_auth == 0 )
        goto exit;

    ssl->record_read = 0;

    // TODO: handshake_failure alert for an anonymous server to request
    // client authentication

    /*
     *  struct {
     *      ClientCertificateType certificate_types<1..2^8-1>;
     *      SignatureAndHashAlgorithm
     *        supported_signature_algorithms<2^16-1>; -- TLS 1.2 only
     *      DistinguishedName certificate_authorities<0..2^16-1>;
     *  } CertificateRequest;
     */
    buf = ssl->in_msg;

    // Retrieve cert types
    //
    cert_type_len = buf[mbedtls_ssl_hs_hdr_len( ssl )];
    n = cert_type_len;

    if( ssl->in_hslen < mbedtls_ssl_hs_hdr_len( ssl ) + 2 + n )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate request message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE_REQUEST );
    }

    p = buf + mbedtls_ssl_hs_hdr_len( ssl ) + 1;
    while( cert_type_len > 0 )
    {
#if defined(MBEDTLS_RSA_C)
        if( *p == MBEDTLS_SSL_CERT_TYPE_RSA_SIGN &&
            mbedtls_pk_can_do( mbedtls_ssl_own_key( ssl ), MBEDTLS_PK_RSA ) )
        {
            ssl->handshake->cert_type = MBEDTLS_SSL_CERT_TYPE_RSA_SIGN;
            break;
        }
        else
#endif
#if defined(MBEDTLS_ECDSA_C)
        if( *p == MBEDTLS_SSL_CERT_TYPE_ECDSA_SIGN &&
            mbedtls_pk_can_do( mbedtls_ssl_own_key( ssl ), MBEDTLS_PK_ECDSA ) )
        {
            ssl->handshake->cert_type = MBEDTLS_SSL_CERT_TYPE_ECDSA_SIGN;
            break;
        }
        else
#endif
        {
            ; /* Unsupported cert type, ignore */
        }

        cert_type_len--;
        p++;
    }

#if defined(MBEDTLS_SSL_PROTO_TLS1_2)
    if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_3 )
    {
        /* Ignored, see comments about hash in write_certificate_verify */
        // TODO: should check the signature part against our pk_key though
        size_t sig_alg_len = ( ( buf[mbedtls_ssl_hs_hdr_len( ssl ) + 1 + n] <<  8 )
                             | ( buf[mbedtls_ssl_hs_hdr_len( ssl ) + 2 + n]       ) );

        m += 2;
        n += sig_alg_len;

        if( ssl->in_hslen < mbedtls_ssl_hs_hdr_len( ssl ) + 2 + n )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate request message" ) );
            return( MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE_REQUEST );
        }
    }
#endif /* MBEDTLS_SSL_PROTO_TLS1_2 */

    /* Ignore certificate_authorities, we only have one cert anyway */
    // TODO: should not send cert if no CA matches
    dn_len = ( ( buf[mbedtls_ssl_hs_hdr_len( ssl ) + 1 + m + n] <<  8 )
             | ( buf[mbedtls_ssl_hs_hdr_len( ssl ) + 2 + m + n]       ) );

    n += dn_len;
    if( ssl->in_hslen != mbedtls_ssl_hs_hdr_len( ssl ) + 3 + m + n )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad certificate request message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_CERTIFICATE_REQUEST );
    }

exit:
    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= parse certificate request" ) );

    return( 0 );
}